

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyRaw(CordRepBtree *this,size_t new_length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CordRepBtree *pCVar6;
  
  pCVar6 = (CordRepBtree *)operator_new(0x40);
  (pCVar6->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  (pCVar6->super_CordRep).length = new_length;
  uVar1 = *(undefined8 *)((long)this->edges_ + 4);
  uVar2 = *(undefined8 *)((long)this->edges_ + 0xc);
  uVar3 = *(undefined8 *)((long)this->edges_ + 0x14);
  uVar4 = *(undefined8 *)((long)this->edges_ + 0x1c);
  uVar5 = *(undefined8 *)((long)this->edges_ + 0x24);
  *(undefined8 *)&(pCVar6->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
  *(undefined8 *)((long)pCVar6->edges_ + 4) = uVar1;
  *(undefined8 *)((long)pCVar6->edges_ + 0xc) = uVar2;
  *(undefined8 *)((long)pCVar6->edges_ + 0x14) = uVar3;
  *(undefined8 *)((long)pCVar6->edges_ + 0x1c) = uVar4;
  *(undefined8 *)((long)pCVar6->edges_ + 0x24) = uVar5;
  *(undefined4 *)((long)pCVar6->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
  return pCVar6;
}

Assistant:

inline CordRepBtree* CordRepBtree::CopyRaw(size_t new_length) const {
  CordRepBtree* tree = new CordRepBtree;

  // `length` and `refcount` are the first members of `CordRepBtree`.
  // We initialize `length` using the given length, have `refcount` be set to
  // ref = 1 through its default constructor, and copy all data beyond
  // 'refcount' which starts with `tag` using a single memcpy: all contents
  // except `refcount` is trivially copyable, and the compiler does not
  // efficiently coalesce member-wise copy of these members.
  // See https://gcc.godbolt.org/z/qY8zsca6z
  // LINT.IfChange(copy_raw)
  tree->length = new_length;
  uint8_t* dst = &tree->tag;
  const uint8_t* src = &tag;
  const ptrdiff_t offset = src - reinterpret_cast<const uint8_t*>(this);
  memcpy(dst, src, sizeof(CordRepBtree) - static_cast<size_t>(offset));
  return tree;
  // LINT.ThenChange()
}